

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.cpp
# Opt level: O1

void __thiscall btDbvt::update(btDbvt *this,btDbvtNode *leaf,int lookahead)

{
  btDbvtNode *pbVar1;
  btDbvtNode *root;
  
  root = removeleaf(this,leaf);
  if (root == (btDbvtNode *)0x0) {
    root = (btDbvtNode *)0x0;
  }
  else if (lookahead < 0) {
    root = this->m_root;
  }
  else if (lookahead != 0) {
    do {
      pbVar1 = root->parent;
      if (pbVar1 == (btDbvtNode *)0x0) break;
      lookahead = lookahead + -1;
      root = pbVar1;
    } while (lookahead != 0);
  }
  insertleaf(this,root,leaf);
  return;
}

Assistant:

void			btDbvt::update(btDbvtNode* leaf,int lookahead)
{
	btDbvtNode*	root=removeleaf(this,leaf);
	if(root)
	{
		if(lookahead>=0)
		{
			for(int i=0;(i<lookahead)&&root->parent;++i)
			{
				root=root->parent;
			}
		} else root=m_root;
	}
	insertleaf(this,root,leaf);
}